

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

void __thiscall
draco::ObjDecoder::MapPointToVertexIndices
          (ObjDecoder *this,PointIndex vert_id,array<int,_3UL> *indices)

{
  int iVar1;
  const_reference pvVar2;
  PointAttribute *this_00;
  undefined4 in_ESI;
  long in_RDI;
  PointAttribute *in_stack_ffffffffffffff28;
  int32_t iVar3;
  PointCloud *in_stack_ffffffffffffff30;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_68;
  undefined4 local_64;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_60;
  undefined4 local_5c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_58;
  undefined4 local_54;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_50;
  undefined4 local_4c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_48;
  undefined4 local_44;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_40;
  undefined4 local_3c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_38;
  undefined4 local_34;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_30;
  undefined4 local_2c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_28;
  undefined4 local_24;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_20;
  undefined4 local_1c;
  undefined4 local_4;
  
  local_4 = in_ESI;
  pvVar2 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                      (size_type)in_stack_ffffffffffffff28);
  if (*pvVar2 < 1) {
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    if (*pvVar2 < 0) {
      PointCloud::attribute
                (in_stack_ffffffffffffff30,(int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_24 = local_4;
      iVar1 = *(int *)(in_RDI + 8);
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                (&local_28,iVar1 + *pvVar2);
      PointAttribute::SetPointMapEntry
                (in_stack_ffffffffffffff28,
                 (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
    }
  }
  else {
    PointCloud::attribute
              (in_stack_ffffffffffffff30,(int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_1c = local_4;
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_20,*pvVar2 - 1);
    PointAttribute::SetPointMapEntry
              (in_stack_ffffffffffffff28,
               (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
  }
  if (-1 < *(int *)(in_RDI + 0x20)) {
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    if (*pvVar2 < 1) {
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      iVar3 = (int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (*pvVar2 < 0) {
        PointCloud::attribute(in_stack_ffffffffffffff30,iVar3);
        local_34 = local_4;
        iVar1 = *(int *)(in_RDI + 0xc);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                            (size_type)in_stack_ffffffffffffff28);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                  (&local_38,iVar1 + *pvVar2);
        PointAttribute::SetPointMapEntry
                  (in_stack_ffffffffffffff28,
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
      }
      else {
        PointCloud::attribute(in_stack_ffffffffffffff30,iVar3);
        local_3c = local_4;
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_40,0);
        PointAttribute::SetPointMapEntry
                  (in_stack_ffffffffffffff28,
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
      }
    }
    else {
      PointCloud::attribute
                (in_stack_ffffffffffffff30,(int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_2c = local_4;
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                (&local_30,*pvVar2 - 1);
      PointAttribute::SetPointMapEntry
                (in_stack_ffffffffffffff28,
                 (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
    }
  }
  if (-1 < *(int *)(in_RDI + 0x24)) {
    pvVar2 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    if (*pvVar2 < 1) {
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      iVar3 = (int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (*pvVar2 < 0) {
        PointCloud::attribute(in_stack_ffffffffffffff30,iVar3);
        local_4c = local_4;
        iVar1 = *(int *)(in_RDI + 0x10);
        pvVar2 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                            (size_type)in_stack_ffffffffffffff28);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                  (&local_50,iVar1 + *pvVar2);
        PointAttribute::SetPointMapEntry
                  (in_stack_ffffffffffffff28,
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
      }
      else {
        PointCloud::attribute(in_stack_ffffffffffffff30,iVar3);
        local_54 = local_4;
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_58,0);
        PointAttribute::SetPointMapEntry
                  (in_stack_ffffffffffffff28,
                   (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
      }
    }
    else {
      PointCloud::attribute
                (in_stack_ffffffffffffff30,(int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_44 = local_4;
      pvVar2 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                (&local_48,*pvVar2 - 1);
      PointAttribute::SetPointMapEntry
                (in_stack_ffffffffffffff28,
                 (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
    }
  }
  if (-1 < *(int *)(in_RDI + 0x28)) {
    in_stack_ffffffffffffff30 =
         (PointCloud *)
         PointCloud::attribute
                   (in_stack_ffffffffffffff30,(int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_5c = local_4;
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
              (&local_60,*(uint *)(in_RDI + 0x38));
    PointAttribute::SetPointMapEntry
              (in_stack_ffffffffffffff28,
               (PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
  }
  if (-1 < *(int *)(in_RDI + 0x2c)) {
    this_00 = PointCloud::attribute
                        (in_stack_ffffffffffffff30,
                         (int32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_64 = local_4;
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
              (&local_68,*(uint *)(in_RDI + 0x18));
    PointAttribute::SetPointMapEntry
              (this_00,(PointIndex)(uint)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (AttributeValueIndex)(uint)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void ObjDecoder::MapPointToVertexIndices(
    PointIndex vert_id, const std::array<int32_t, 3> &indices) {
  // Use face entries to store mapping between vertex and attribute indices
  // (positions, texture coordinates and normal indices).
  // Any given index is used when indices[x] != 0. For positive values, the
  // point is mapped directly to the specified attribute index. Negative input
  // indices indicate addressing from the last element (e.g. -1 is the last
  // attribute value of a given type, -2 the second last, etc.).
  if (indices[0] > 0) {
    out_point_cloud_->attribute(pos_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[0] - 1));
  } else if (indices[0] < 0) {
    out_point_cloud_->attribute(pos_att_id_)
        ->SetPointMapEntry(vert_id,
                           AttributeValueIndex(num_positions_ + indices[0]));
  }

  if (tex_att_id_ >= 0) {
    if (indices[1] > 0) {
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[1] - 1));
    } else if (indices[1] < 0) {
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id,
                             AttributeValueIndex(num_tex_coords_ + indices[1]));
    } else {
      // Texture index not provided but expected. Insert 0 entry as the
      // default value.
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(0));
    }
  }

  if (norm_att_id_ >= 0) {
    if (indices[2] > 0) {
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[2] - 1));
    } else if (indices[2] < 0) {
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id,
                             AttributeValueIndex(num_normals_ + indices[2]));
    } else {
      // Normal index not provided but expected. Insert 0 entry as the default
      // value.
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(0));
    }
  }

  // Assign material index to the point if it is available.
  if (material_att_id_ >= 0) {
    out_point_cloud_->attribute(material_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(last_material_id_));
  }

  // Assign sub-object index to the point if it is available.
  if (sub_obj_att_id_ >= 0) {
    out_point_cloud_->attribute(sub_obj_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(last_sub_obj_id_));
  }
}